

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve.hpp
# Opt level: O2

vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
* __thiscall
Curve<3,_2>::sampleWithArcLengthParameterized
          (vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
           *__return_storage_ptr__,Curve<3,_2> *this,double *delta,bool arc_length_base,
          int *max_iter_time,vector<double,_std::allocator<double>_> *arc_length_t)

{
  double *pdVar1;
  pointer pMVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  value_type_conflict1 vVar6;
  undefined7 in_register_00000009;
  ulong uVar7;
  int j_1;
  long lVar8;
  size_type __n;
  int i;
  long lVar9;
  double dVar10;
  RealScalar RVar11;
  double dVar12;
  double local_f0;
  undefined8 local_e8;
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  *local_e0;
  value_type_conflict1 local_d8;
  double dStack_d0;
  _Vector_base<double,_std::allocator<double>_> local_b8;
  undefined4 local_94;
  double local_90;
  vector<double,_std::allocator<double>_> *local_88;
  int *local_80;
  ulong local_78;
  double local_70;
  double local_68;
  vector<double,_std::allocator<double>_> dists;
  
  dVar12 = *delta;
  dVar10 = this->length_;
  if ((int)CONCAT71(in_register_00000009,arc_length_base) == 0) {
    local_70 = dVar12 * dVar10;
    local_f0 = dVar12;
  }
  else {
    local_f0 = dVar12 / dVar10;
    local_70 = dVar12;
  }
  local_80 = max_iter_time;
  if ((local_70 < 0.0) || (dVar10 * 0.5 < local_70)) {
    __assert_fail("avg_distance >= 0 && avg_distance <= this->length_ / 2.0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tanzby[P]ParametricCurve/src/curve.hpp"
                  ,0x6b,
                  "virtual vector<PointType> Curve<>::sampleWithArcLengthParameterized(const double &, bool, const int &, vector<double> *) [N = 3, PointDim = 2]"
                 );
  }
  dVar10 = dVar10 / local_70;
  __n = (size_type)(int)dVar10;
  dists.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_b8,__n,(value_type_conflict1 *)&dists
             ,(allocator_type *)&local_d8);
  local_d8 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&dists,__n,&local_d8,(allocator_type *)&local_e8);
  std::
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  ::vector(__return_storage_ptr__,(long)((int)dVar10 + 1),(allocator_type *)&local_d8);
  local_e8 = 0;
  local_94 = 0;
  local_e0 = __return_storage_ptr__;
  (*this->_vptr_Curve[2])(&local_d8,this);
  pMVar2 = (__return_storage_ptr__->
           super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array[0] =
       local_d8;
  (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array[1] =
       dStack_d0;
  local_e8 = 0x3ff0000000000000;
  local_94 = 0;
  local_88 = arc_length_t;
  (*this->_vptr_Curve[2])(&local_d8,this);
  pMVar2 = (__return_storage_ptr__->
           super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pMVar2[-1].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
       = local_d8;
  pMVar2[-1].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]
       = dStack_d0;
  lVar8 = 8;
  for (lVar9 = 1; lVar9 < (long)__n; lVar9 = lVar9 + 1) {
    *(double *)((long)local_b8._M_impl.super__Vector_impl_data._M_start + lVar8) =
         (double)(int)lVar9 * local_f0;
    local_e8 = local_e8 & 0xffffffff00000000;
    (*this->_vptr_Curve[2])
              (&local_d8,this,(long)local_b8._M_impl.super__Vector_impl_data._M_start + lVar8);
    pdVar1 = (double *)
             ((long)(((local_e0->
                      super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                      )._M_impl.super__Vector_impl_data._M_start)->
                    super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
                    array + lVar8 * 2);
    *pdVar1 = local_d8;
    pdVar1[1] = dStack_d0;
    lVar8 = lVar8 + 8;
  }
  local_d8 = 1.0;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            ((vector<double,_std::allocator<double>_> *)&local_b8,&local_d8);
  uVar7 = 0;
  local_90 = -1.0;
  do {
    if (*local_80 <= (int)uVar7) break;
    lVar8 = 0;
    local_78 = uVar7;
    for (lVar9 = 1; lVar9 < (long)__n; lVar9 = lVar9 + 1) {
      pMVar2 = (local_e0->
               super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_d8 = (value_type_conflict1)
                 ((long)pMVar2[1].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
                        m_storage.m_data.array + lVar8);
      dStack_d0 = (double)((long)(pMVar2->
                                 super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).
                                 m_storage.m_data.array + lVar8);
      RVar11 = Eigen::
               MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
               ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                       *)&local_d8);
      dists.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar9] = RVar11;
      lVar8 = lVar8 + 0x10;
    }
    local_f0 = 0.0;
    lVar9 = 8;
    for (lVar8 = 1; lVar8 < (long)__n; lVar8 = lVar8 + 1) {
      local_68 = *(double *)
                  ((long)dists.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar9);
      local_e8._0_4_ = 1;
      (*this->_vptr_Curve[2])
                ((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                  *)&local_d8,this,(long)local_b8._M_impl.super__Vector_impl_data._M_start + lVar9,
                 &local_e8);
      dVar12 = dStack_d0;
      vVar6 = local_d8;
      local_e8._0_4_ = 2;
      (*this->_vptr_Curve[2])
                ((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                  *)&local_d8,this,(long)local_b8._M_impl.super__Vector_impl_data._M_start + lVar9,
                 &local_e8);
      local_f0 = local_f0 + (local_68 - local_70);
      dVar12 = SQRT(dVar12 * dVar12 + vVar6 * vVar6);
      *(double *)((long)local_b8._M_impl.super__Vector_impl_data._M_start + lVar9) =
           *(double *)((long)local_b8._M_impl.super__Vector_impl_data._M_start + lVar9) -
           (local_f0 * dVar12) /
           (SQRT(dStack_d0 * dStack_d0 + local_d8 * local_d8) * local_f0 + dVar12 * dVar12);
      local_e8 = (ulong)local_e8._4_4_ << 0x20;
      (*this->_vptr_Curve[2])
                ((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                  *)&local_d8,this,(long)local_b8._M_impl.super__Vector_impl_data._M_start + lVar9,
                 &local_e8);
      pdVar1 = (double *)
               ((long)(((local_e0->
                        super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                        )._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data
                      .array + lVar9 * 2);
      *pdVar1 = local_d8;
      pdVar1[1] = dStack_d0;
      lVar9 = lVar9 + 8;
    }
    if (local_f0 < 1e-06) break;
    dVar12 = local_f0 - local_90;
    uVar7 = (ulong)((int)local_78 + 1);
    local_90 = local_f0;
  } while (1e-06 <= ABS(dVar12));
  if (local_88 != (vector<double,_std::allocator<double>_> *)0x0) {
    pdVar3 = (local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = local_b8._M_impl.super__Vector_impl_data._M_end_of_storage;
    pdVar4 = (local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    (local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_start = local_b8._M_impl.super__Vector_impl_data._M_start;
    (local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = local_b8._M_impl.super__Vector_impl_data._M_finish;
    local_b8._M_impl.super__Vector_impl_data._M_start = pdVar4;
    local_b8._M_impl.super__Vector_impl_data._M_finish = pdVar5;
    local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = pdVar3;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&dists.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_b8);
  return local_e0;
}

Assistant:

virtual auto sampleWithArcLengthParameterized(const double& delta,
                                                bool arc_length_base = true,
                                                const int& max_iter_time = 4,
                                                vector<double>* arc_length_t = nullptr)
      -> vector<PointType> {
    const double avg_distance = arc_length_base ? delta : this->length_ * delta;

    const double avg_t = arc_length_base ? avg_distance / this->length_ : delta;

    assert(avg_distance >= 0 && avg_distance <= this->length_ / 2.0);

    const int n(this->length_ / avg_distance);

    vector<double> t_array(n, 0);
    vector<double> dists(n, 0);
    vector<PointType> ret(n + 1);  // 实际上总共有 n+1 个点
    ret.front() = this->at(0.0);
    ret.back() = this->at(1.0);

    // 第一个点与最后一个点保持在开始与结尾处
    for (int i = 1; i < n; ++i) {
      t_array[i] = i * avg_t;
      ret[i] = this->at(t_array[i]);
    }
    t_array.emplace_back(1.0);

    double prev_offset = -1;

    for (int iter = 0; iter < max_iter_time; ++iter) {
      // 1. 计算上一次迭代确定的 t 参数下，每一个分段的近似长度
      for (int j = 1; j < n; j++) {
        dists[j] = (ret[j] - ret[j - 1]).norm();
      }

      double offset = 0;
      for (int j = 1; j < n; j++) {
        // 2. 累计近似弧长并计算误差
        offset += dists[j] - avg_distance;

        // 3. Newton's method
        double first_order = this->at(t_array[j], 1).norm();
        double second_order = this->at(t_array[j], 2).norm();
        double numerator = offset * first_order;
        double denominator = offset * second_order + first_order * first_order;

        t_array[j] = t_array[j] - numerator / denominator;

        ret[j] = this->at(t_array[j]);
      }

      if (offset < EPS || abs(offset - prev_offset) < EPS) {
        break;
      }
      prev_offset = offset;
    }

    if (arc_length_t != nullptr) {
      arc_length_t->swap(t_array);
    }

    return ret;
  }